

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention_x86.cpp
# Opt level: O0

int __thiscall
ncnn::MultiHeadAttention_x86::destroy_pipeline(MultiHeadAttention_x86 *this,Option *_opt)

{
  void *in_RSI;
  long in_RDI;
  Option opt;
  undefined1 local_50 [39];
  undefined1 local_29;
  
  memcpy(local_50,in_RSI,0x40);
  if (*(int *)(in_RDI + 0xec) != 0) {
    local_29 = 0;
  }
  if (*(long *)(in_RDI + 0x440) != 0) {
    (**(code **)(**(long **)(in_RDI + 0x440) + 0x28))(*(long **)(in_RDI + 0x440),local_50);
    if (*(long **)(in_RDI + 0x440) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDI + 0x440) + 8))();
    }
    *(undefined8 *)(in_RDI + 0x440) = 0;
  }
  if (*(long *)(in_RDI + 0x410) != 0) {
    (**(code **)(**(long **)(in_RDI + 0x410) + 0x28))(*(long **)(in_RDI + 0x410),local_50);
    if (*(long **)(in_RDI + 0x410) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDI + 0x410) + 8))();
    }
    *(undefined8 *)(in_RDI + 0x410) = 0;
  }
  if (*(long *)(in_RDI + 0x418) != 0) {
    (**(code **)(**(long **)(in_RDI + 0x418) + 0x28))(*(long **)(in_RDI + 0x418),local_50);
    if (*(long **)(in_RDI + 0x418) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDI + 0x418) + 8))();
    }
    *(undefined8 *)(in_RDI + 0x418) = 0;
  }
  if (*(long *)(in_RDI + 0x420) != 0) {
    (**(code **)(**(long **)(in_RDI + 0x420) + 0x28))(*(long **)(in_RDI + 0x420),local_50);
    if (*(long **)(in_RDI + 0x420) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDI + 0x420) + 8))();
    }
    *(undefined8 *)(in_RDI + 0x420) = 0;
  }
  if (*(long *)(in_RDI + 0x428) != 0) {
    (**(code **)(**(long **)(in_RDI + 0x428) + 0x28))(*(long **)(in_RDI + 0x428),local_50);
    if (*(long **)(in_RDI + 0x428) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDI + 0x428) + 8))();
    }
    *(undefined8 *)(in_RDI + 0x428) = 0;
  }
  if (*(long *)(in_RDI + 0x430) != 0) {
    (**(code **)(**(long **)(in_RDI + 0x430) + 0x28))(*(long **)(in_RDI + 0x430),local_50);
    if (*(long **)(in_RDI + 0x430) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDI + 0x430) + 8))();
    }
    *(undefined8 *)(in_RDI + 0x430) = 0;
  }
  if (*(long *)(in_RDI + 0x438) != 0) {
    (**(code **)(**(long **)(in_RDI + 0x438) + 0x28))(*(long **)(in_RDI + 0x438),local_50);
    if (*(long **)(in_RDI + 0x438) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDI + 0x438) + 8))();
    }
    *(undefined8 *)(in_RDI + 0x438) = 0;
  }
  return 0;
}

Assistant:

int MultiHeadAttention_x86::destroy_pipeline(const Option& _opt)
{
    Option opt = _opt;
    if (int8_scale_term)
    {
        opt.use_packing_layout = false; // TODO enable packing
    }

    if (qk_softmax)
    {
        qk_softmax->destroy_pipeline(opt);
        delete qk_softmax;
        qk_softmax = 0;
    }

    if (q_gemm)
    {
        q_gemm->destroy_pipeline(opt);
        delete q_gemm;
        q_gemm = 0;
    }

    if (k_gemm)
    {
        k_gemm->destroy_pipeline(opt);
        delete k_gemm;
        k_gemm = 0;
    }

    if (v_gemm)
    {
        v_gemm->destroy_pipeline(opt);
        delete v_gemm;
        v_gemm = 0;
    }

    if (o_gemm)
    {
        o_gemm->destroy_pipeline(opt);
        delete o_gemm;
        o_gemm = 0;
    }

    if (qk_gemm)
    {
        qk_gemm->destroy_pipeline(opt);
        delete qk_gemm;
        qk_gemm = 0;
    }
    if (qkv_gemm)
    {
        qkv_gemm->destroy_pipeline(opt);
        delete qkv_gemm;
        qkv_gemm = 0;
    }

    return 0;
}